

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

vector<bool,_std::allocator<bool>_> * __thiscall
spoa::Graph::ExtractSubgraph
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,Graph *this,Node *begin,
          Node *end)

{
  Node *pNVar1;
  pointer ppEVar2;
  value_type *ppNVar3;
  _Elt_pointer ppNVar4;
  Edge **it;
  pointer ppEVar5;
  value_type *__x;
  reference rVar6;
  stack<const_spoa::Graph::Node_*,_std::deque<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>_>
  stack;
  allocator_type local_89;
  Node *local_88;
  _Deque_base<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_> local_80;
  
  local_80._M_impl.super__Deque_impl_data._M_map._0_1_ = 0;
  local_88 = begin;
  std::vector<bool,_std::allocator<bool>_>::vector
            (__return_storage_ptr__,
             (long)(this->nodes_).
                   super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->nodes_).
                   super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(bool *)&local_80,&local_89);
  std::
  stack<spoa::Graph::Node_const*,std::deque<spoa::Graph::Node_const*,std::allocator<spoa::Graph::Node_const*>>>
  ::stack<std::deque<spoa::Graph::Node_const*,std::allocator<spoa::Graph::Node_const*>>,void>
            ((stack<const_spoa::Graph::Node_*,_std::deque<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>_>
              *)&local_80);
  std::deque<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>::push_back
            ((deque<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_> *)
             &local_80,&local_88);
  while (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         local_80._M_impl.super__Deque_impl_data._M_start._M_cur) {
    ppNVar4 = local_80._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_80._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppNVar4 = local_80._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pNVar1 = ppNVar4[-1];
    std::deque<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>::pop_back
              ((deque<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_> *)
               &local_80);
    rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (__return_storage_ptr__,(ulong)pNVar1->id);
    if (((*rVar6._M_p & rVar6._M_mask) == 0) && (end->id <= pNVar1->id)) {
      ppEVar2 = (pNVar1->inedges).
                super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppEVar5 = (pNVar1->inedges).
                     super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppEVar5 != ppEVar2;
          ppEVar5 = ppEVar5 + 1) {
        std::deque<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>::push_back
                  ((deque<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_> *)
                   &local_80,&(*ppEVar5)->tail);
      }
      ppNVar3 = (pNVar1->aligned_nodes).
                super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (__x = (pNVar1->aligned_nodes).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; __x != ppNVar3; __x = __x + 1) {
        std::deque<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>::push_back
                  ((deque<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_> *)
                   &local_80,__x);
      }
      rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (__return_storage_ptr__,(ulong)pNVar1->id);
      *rVar6._M_p = *rVar6._M_p | rVar6._M_mask;
    }
  }
  std::_Deque_base<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>::
  ~_Deque_base(&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::vector<bool> Graph::ExtractSubgraph(const Node* begin, const Node* end) const {  // NOLINT
  std::vector<bool> dst(nodes_.size(), false);
  std::stack<const Node*> stack;
  stack.push(begin);

  while (!stack.empty()) {
    auto curr = stack.top();
    stack.pop();

    if (!dst[curr->id] && curr->id >= end->id) {
      for (const auto& it : curr->inedges) {
        stack.push(it->tail);
      }
      for (const auto& it : curr->aligned_nodes) {
        stack.push(it);
      }
      dst[curr->id] = true;
    }
  }

  return dst;
}